

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::fboc::details::Context::Context
          (Context *this,TestContext *testCtx,RenderContext *renderCtx,CheckerFactory *factory)

{
  _Rb_tree_header *p_Var1;
  RenderContext *in_R8;
  FormatExtEntries extFmts;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = renderCtx;
  p_Var1 = &(this->m_coreFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header;
  (this->m_coreFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->m_coreFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_coreFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_coreFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_coreFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_coreFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header;
  (this->m_coreFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_coreFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_coreFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_coreFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_coreFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_ctxFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header;
  (this->m_ctxFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ctxFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_ctxFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_ctxFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_ctxFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_ctxFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header;
  (this->m_ctxFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_ctxFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_ctxFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_ctxFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_ctxFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_allFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header;
  (this->m_allFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_allFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_allFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_allFormats).m_formatFlags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_allFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header;
  (this->m_allFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_allFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_allFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_allFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_allFormats).m_formatExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FboUtil::FboVerifier::FboVerifier(&this->m_verifier,&this->m_ctxFormats,factory,renderCtx);
  this->m_haveMultiColorAtts = false;
  extFmts.m_end = (FormatExtEntry *)this->m_renderCtx;
  extFmts.m_begin = (FormatExtEntry *)createRenderableTests::attPoints;
  FboUtil::addExtFormats((FboUtil *)&this->m_ctxFormats,(FormatDB *)s_esExtFormats,extFmts,in_R8);
  FboUtil::addExtFormats
            ((FboUtil *)&this->m_allFormats,(FormatDB *)s_esExtFormats,
             (FormatExtEntries)ZEXT816(0xd54090),in_R8);
  return;
}

Assistant:

Context::Context (TestContext& testCtx,
				  RenderContext& renderCtx,
				  CheckerFactory& factory)
	: m_testCtx				(testCtx)
	, m_renderCtx			(renderCtx)
	, m_verifier			(m_ctxFormats, factory, renderCtx)
	, m_haveMultiColorAtts	(false)
{
	FormatExtEntries extRange = GLS_ARRAY_RANGE(s_esExtFormats);
	addExtFormats(extRange);
}